

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprCompare(Parse *pParse,Expr *pA,Expr *pB,int iTab)

{
  u32 *puVar1;
  u8 uVar2;
  short sVar3;
  char *zLeft;
  sqlite3_value *v;
  int iVar4;
  uint uVar5;
  sqlite3_value *pVal;
  u8 aff;
  uint uVar6;
  u8 uVar7;
  uint uVar8;
  sqlite3_value *local_38;
  
  if (pA == (Expr *)0x0 || pB == (Expr *)0x0) {
    return (uint)(pB != pA) * 2;
  }
  if ((pParse != (Parse *)0x0) && (pA->op == 0x94)) {
    local_38 = (Mem *)0x0;
    valueFromExpr(pParse->db,pB,'\x01','A',&local_38,(ValueNewStat4Ctx *)0x0);
    v = local_38;
    if (local_38 != (Mem *)0x0) {
      sVar3 = pA->iColumn;
      uVar5 = 0x80000000;
      if (sVar3 < 0x20) {
        uVar5 = 1 << ((char)sVar3 - 1U & 0x1f);
      }
      puVar1 = &pParse->pVdbe->expmask;
      *puVar1 = *puVar1 | uVar5;
      pVal = sqlite3VdbeGetBoundValue(pParse->pReprepare,(int)sVar3,aff);
      if (pVal == (sqlite3_value *)0x0) {
        sqlite3ValueFree(v);
      }
      else {
        if ((pVal->flags & 0xf) == 2) {
          sqlite3ValueText(pVal,'\x01');
        }
        iVar4 = sqlite3MemCompare(pVal,v,(CollSeq *)0x0);
        sqlite3ValueFree(v);
        sqlite3ValueFree(pVal);
        if (iVar4 == 0) {
          return 0;
        }
      }
    }
  }
  uVar5 = pA->flags;
  uVar6 = pB->flags;
  uVar8 = uVar6 | uVar5;
  if ((uVar8 >> 10 & 1) != 0) {
    if (((uVar5 & uVar6) >> 10 & 1) == 0) {
      return 2;
    }
    if ((pA->u).iValue == (pB->u).iValue) {
      return 0;
    }
    return 2;
  }
  uVar2 = pA->op;
  uVar7 = pB->op;
  if (uVar2 == 'G' || uVar2 != uVar7) {
    if (uVar2 == 'j') {
      uVar5 = sqlite3ExprCompare(pParse,pA->pLeft,pB,iTab);
      if (uVar5 < 2) {
        return 1;
      }
      uVar7 = pB->op;
    }
    if ((uVar7 == 'j') && (uVar5 = sqlite3ExprCompare(pParse,pA,pB->pLeft,iTab), uVar5 < 2)) {
      return 1;
    }
    return 2;
  }
  if (((uVar2 == 0xa2) || (uVar2 == 0xa4)) || (zLeft = (pA->u).zToken, zLeft == (char *)0x0))
  goto LAB_0016e72c;
  if (uVar2 == 'j') {
    if ((pB->u).zToken == (char *)0x0) {
      return 2;
    }
    iVar4 = sqlite3StrICmp(zLeft,(pB->u).zToken);
  }
  else {
    if (uVar2 == 'r') {
      return 0;
    }
    if (uVar2 == 0xa1) {
      iVar4 = sqlite3StrICmp(zLeft,(pB->u).zToken);
      if (iVar4 != 0) {
        return 2;
      }
      if ((uVar5 >> 0x18 & 1) != 0) {
        iVar4 = sqlite3WindowCompare(pParse,(pA->y).pWin,(pB->y).pWin);
        if (iVar4 != 0) {
          return 2;
        }
        uVar5 = pA->flags;
        uVar6 = pB->flags;
      }
      goto LAB_0016e72c;
    }
    if ((pB->u).zToken == (char *)0x0) goto LAB_0016e72c;
    iVar4 = strcmp(zLeft,(pB->u).zToken);
  }
  if (iVar4 != 0) {
    return 2;
  }
LAB_0016e72c:
  if (((uVar6 ^ uVar5) & 2) != 0) {
    return 2;
  }
  if ((uVar8 >> 0xe & 1) == 0) {
    if ((uVar8 >> 0xb & 1) != 0) {
      return 2;
    }
    if (((uVar8 & 8) == 0) &&
       (iVar4 = sqlite3ExprCompare(pParse,pA->pLeft,pB->pLeft,iTab), iVar4 != 0)) {
      return 2;
    }
    iVar4 = sqlite3ExprCompare(pParse,pA->pRight,pB->pRight,iTab);
    if (iVar4 != 0) {
      return 2;
    }
    iVar4 = sqlite3ExprListCompare((pA->x).pList,(pB->x).pList,iTab);
    if (iVar4 != 0) {
      return 2;
    }
    if (((pA->op != 'n') && (pA->op != 0x9f)) && ((uVar8 >> 0xd & 1) == 0)) {
      if (pA->iColumn != pB->iColumn) {
        return 2;
      }
      if ((pA->iTable != pB->iTable) && (-1 < pB->iTable || pA->iTable != iTab)) {
        return 2;
      }
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCompare(Parse *pParse, Expr *pA, Expr *pB, int iTab){
  u32 combinedFlags;
  if( pA==0 || pB==0 ){
    return pB==pA ? 0 : 2;
  }
  if( pParse && pA->op==TK_VARIABLE && exprCompareVariable(pParse, pA, pB) ){
    return 0;
  }
  combinedFlags = pA->flags | pB->flags;
  if( combinedFlags & EP_IntValue ){
    if( (pA->flags&pB->flags&EP_IntValue)!=0 && pA->u.iValue==pB->u.iValue ){
      return 0;
    }
    return 2;
  }
  if( pA->op!=pB->op || pA->op==TK_RAISE ){
    if( pA->op==TK_COLLATE && sqlite3ExprCompare(pParse, pA->pLeft,pB,iTab)<2 ){
      return 1;
    }
    if( pB->op==TK_COLLATE && sqlite3ExprCompare(pParse, pA,pB->pLeft,iTab)<2 ){
      return 1;
    }
    return 2;
  }
  if( pA->op!=TK_COLUMN && pA->op!=TK_AGG_COLUMN && pA->u.zToken ){
    if( pA->op==TK_FUNCTION ){
      if( sqlite3StrICmp(pA->u.zToken,pB->u.zToken)!=0 ) return 2;
#ifndef SQLITE_OMIT_WINDOWFUNC
      /* Justification for the assert():
      ** window functions have p->op==TK_FUNCTION but aggregate functions
      ** have p->op==TK_AGG_FUNCTION.  So any comparison between an aggregate
      ** function and a window function should have failed before reaching
      ** this point.  And, it is not possible to have a window function and
      ** a scalar function with the same name and number of arguments.  So
      ** if we reach this point, either A and B both window functions or
      ** neither are a window functions. */
      assert( ExprHasProperty(pA,EP_WinFunc)==ExprHasProperty(pB,EP_WinFunc) );
      if( ExprHasProperty(pA,EP_WinFunc) ){
        if( sqlite3WindowCompare(pParse,pA->y.pWin,pB->y.pWin)!=0 ) return 2;
      }
#endif
    }else if( pA->op==TK_NULL ){
      return 0;
    }else if( pA->op==TK_COLLATE ){
      if( sqlite3_stricmp(pA->u.zToken,pB->u.zToken)!=0 ) return 2;
    }else if( ALWAYS(pB->u.zToken!=0) && strcmp(pA->u.zToken,pB->u.zToken)!=0 ){
      return 2;
    }
  }
  if( (pA->flags & EP_Distinct)!=(pB->flags & EP_Distinct) ) return 2;
  if( (combinedFlags & EP_TokenOnly)==0 ){
    if( combinedFlags & EP_xIsSelect ) return 2;
    if( (combinedFlags & EP_FixedCol)==0
     && sqlite3ExprCompare(pParse, pA->pLeft, pB->pLeft, iTab) ) return 2;
    if( sqlite3ExprCompare(pParse, pA->pRight, pB->pRight, iTab) ) return 2;
    if( sqlite3ExprListCompare(pA->x.pList, pB->x.pList, iTab) ) return 2;
    if( pA->op!=TK_STRING
     && pA->op!=TK_TRUEFALSE
     && (combinedFlags & EP_Reduced)==0
    ){
      if( pA->iColumn!=pB->iColumn ) return 2;
      if( pA->iTable!=pB->iTable 
       && (pA->iTable!=iTab || NEVER(pB->iTable>=0)) ) return 2;
    }
  }
  return 0;
}